

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CanSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
CanSimulationDataGenerator::CreateDataOrRemoteFrame
          (CanSimulationDataGenerator *this,U32 identifier,bool use_extended_frame_format,
          bool remote_frame,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,
          bool get_ack_in_response)

{
  size_type sVar1;
  byte *pbVar2;
  iterator __first;
  iterator __last;
  __normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_> local_f8;
  const_iterator local_f0;
  BitState *local_e8;
  BitState *local_e0;
  __normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_> local_d8;
  __normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_> local_d0;
  const_iterator local_c8;
  BitState local_bc;
  uint local_b8;
  BitState local_b4;
  U32 i_5;
  BitState local_ac;
  BitState local_a8;
  BitState local_a4;
  uint local_a0;
  uint local_9c;
  U32 j;
  U32 mask_3;
  U32 dat;
  U32 i_4;
  uint local_88;
  uint local_84;
  U32 i_3;
  U32 mask;
  U32 data_size;
  BitState local_74;
  BitState local_70;
  BitState local_6c;
  BitState local_68;
  uint local_64;
  uint local_60;
  U32 i_2;
  U32 mask_2;
  BitState local_54;
  BitState local_50;
  BitState local_4c;
  BitState local_48;
  uint local_44;
  BitState local_40;
  U32 i_1;
  BitState local_38;
  BitState local_34;
  uint local_30;
  uint local_2c;
  U32 i;
  U32 mask_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_20;
  bool get_ack_in_response_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  bool remote_frame_local;
  bool use_extended_frame_format_local;
  CanSimulationDataGenerator *pCStack_10;
  U32 identifier_local;
  CanSimulationDataGenerator *this_local;
  
  mask_1._3_1_ = get_ack_in_response;
  pvStack_20 = data;
  data_local._2_1_ = remote_frame;
  data_local._3_1_ = use_extended_frame_format;
  data_local._4_4_ = identifier;
  pCStack_10 = this;
  std::vector<BitState,_std::allocator<BitState>_>::clear(&this->mFakeStuffedBits);
  std::vector<BitState,_std::allocator<BitState>_>::clear(&this->mFakeFixedFormBits);
  std::vector<BitState,_std::allocator<BitState>_>::clear(&this->mFakeStartOfFrameField);
  std::vector<BitState,_std::allocator<BitState>_>::clear(&this->mFakeArbitrationField);
  std::vector<BitState,_std::allocator<BitState>_>::clear(&this->mFakeControlField);
  std::vector<BitState,_std::allocator<BitState>_>::clear(&this->mFakeDataField);
  std::vector<BitState,_std::allocator<BitState>_>::clear(&this->mFakeCrcFieldWithoutDelimiter);
  std::vector<BitState,_std::allocator<BitState>_>::clear(&this->mFakeAckField);
  std::vector<BitState,_std::allocator<BitState>_>::clear(&this->mFakeEndOfFrame);
  i = CanAnalyzerSettings::Dominant(this->mSettings);
  std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFakeStartOfFrameField,&i);
  if ((data_local._3_1_ & 1) == 1) {
    local_2c = 0x10000000;
    for (local_30 = 0; local_30 < 0xb; local_30 = local_30 + 1) {
      if ((local_2c & data_local._4_4_) == 0) {
        local_34 = CanAnalyzerSettings::Dominant(this->mSettings);
        std::vector<BitState,_std::allocator<BitState>_>::push_back
                  (&this->mFakeArbitrationField,&local_34);
      }
      else {
        local_38 = CanAnalyzerSettings::Recessive(this->mSettings);
        std::vector<BitState,_std::allocator<BitState>_>::push_back
                  (&this->mFakeArbitrationField,&local_38);
      }
      local_2c = local_2c >> 1;
    }
    i_1 = CanAnalyzerSettings::Recessive(this->mSettings);
    std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFakeArbitrationField,&i_1);
    local_40 = CanAnalyzerSettings::Recessive(this->mSettings);
    std::vector<BitState,_std::allocator<BitState>_>::push_back
              (&this->mFakeArbitrationField,&local_40);
    for (local_44 = 0; local_44 < 0x12; local_44 = local_44 + 1) {
      if ((local_2c & data_local._4_4_) == 0) {
        local_48 = CanAnalyzerSettings::Dominant(this->mSettings);
        std::vector<BitState,_std::allocator<BitState>_>::push_back
                  (&this->mFakeArbitrationField,&local_48);
      }
      else {
        local_4c = CanAnalyzerSettings::Recessive(this->mSettings);
        std::vector<BitState,_std::allocator<BitState>_>::push_back
                  (&this->mFakeArbitrationField,&local_4c);
      }
      local_2c = local_2c >> 1;
    }
    if ((data_local._2_1_ & 1) == 1) {
      local_50 = CanAnalyzerSettings::Recessive(this->mSettings);
      std::vector<BitState,_std::allocator<BitState>_>::push_back
                (&this->mFakeArbitrationField,&local_50);
    }
    else {
      local_54 = CanAnalyzerSettings::Dominant(this->mSettings);
      std::vector<BitState,_std::allocator<BitState>_>::push_back
                (&this->mFakeArbitrationField,&local_54);
    }
    mask_2 = CanAnalyzerSettings::Recessive(this->mSettings);
    std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFakeControlField,&mask_2);
    i_2 = CanAnalyzerSettings::Recessive(this->mSettings);
    std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFakeControlField,&i_2);
  }
  else {
    local_60 = 0x400;
    for (local_64 = 0; local_64 < 0xb; local_64 = local_64 + 1) {
      if ((local_60 & data_local._4_4_) == 0) {
        local_68 = CanAnalyzerSettings::Dominant(this->mSettings);
        std::vector<BitState,_std::allocator<BitState>_>::push_back
                  (&this->mFakeArbitrationField,&local_68);
      }
      else {
        local_6c = CanAnalyzerSettings::Recessive(this->mSettings);
        std::vector<BitState,_std::allocator<BitState>_>::push_back
                  (&this->mFakeArbitrationField,&local_6c);
      }
      local_60 = local_60 >> 1;
    }
    if ((data_local._2_1_ & 1) == 1) {
      local_70 = CanAnalyzerSettings::Recessive(this->mSettings);
      std::vector<BitState,_std::allocator<BitState>_>::push_back
                (&this->mFakeArbitrationField,&local_70);
    }
    else {
      local_74 = CanAnalyzerSettings::Dominant(this->mSettings);
      std::vector<BitState,_std::allocator<BitState>_>::push_back
                (&this->mFakeArbitrationField,&local_74);
    }
    data_size = CanAnalyzerSettings::Dominant(this->mSettings);
    std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFakeControlField,&data_size)
    ;
    mask = CanAnalyzerSettings::Dominant(this->mSettings);
    std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFakeControlField,&mask);
  }
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvStack_20);
  i_3 = (U32)sVar1;
  if (9 < i_3) {
    AnalyzerHelpers::Assert("can\'t sent more than 8 bytes");
  }
  if (((data_local._2_1_ & 1) == 1) && (i_3 != 0)) {
    AnalyzerHelpers::Assert("remote frames can\'t send data");
  }
  local_84 = 8;
  for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
    if ((local_84 & i_3) == 0) {
      i_4 = CanAnalyzerSettings::Dominant(this->mSettings);
      std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFakeControlField,&i_4);
    }
    else {
      dat = CanAnalyzerSettings::Recessive(this->mSettings);
      std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFakeControlField,&dat);
    }
    local_84 = local_84 >> 1;
  }
  if ((data_local._2_1_ & 1) == 0) {
    for (mask_3 = 0; mask_3 < i_3; mask_3 = mask_3 + 1) {
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (pvStack_20,(ulong)mask_3);
      j = (U32)*pbVar2;
      local_9c = 0x80;
      for (local_a0 = 0; local_a0 < 8; local_a0 = local_a0 + 1) {
        if ((local_9c & j) == 0) {
          local_a4 = CanAnalyzerSettings::Dominant(this->mSettings);
          std::vector<BitState,_std::allocator<BitState>_>::push_back
                    (&this->mFakeDataField,&local_a4);
        }
        else {
          local_a8 = CanAnalyzerSettings::Recessive(this->mSettings);
          std::vector<BitState,_std::allocator<BitState>_>::push_back
                    (&this->mFakeDataField,&local_a8);
        }
        local_9c = local_9c >> 1;
      }
    }
  }
  AddCrc(this);
  if ((mask_1._3_1_ & 1) == 1) {
    local_ac = CanAnalyzerSettings::Dominant(this->mSettings);
    std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFakeAckField,&local_ac);
  }
  else {
    i_5 = CanAnalyzerSettings::Recessive(this->mSettings);
    std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFakeAckField,&i_5);
  }
  local_b4 = CanAnalyzerSettings::Recessive(this->mSettings);
  std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFakeAckField,&local_b4);
  for (local_b8 = 0; local_b8 < 7; local_b8 = local_b8 + 1) {
    local_bc = CanAnalyzerSettings::Recessive(this->mSettings);
    std::vector<BitState,_std::allocator<BitState>_>::push_back(&this->mFakeEndOfFrame,&local_bc);
  }
  local_d0._M_current =
       (BitState *)std::vector<BitState,_std::allocator<BitState>_>::end(&this->mFakeFixedFormBits);
  __gnu_cxx::__normal_iterator<BitState_const*,std::vector<BitState,std::allocator<BitState>>>::
  __normal_iterator<BitState*>
            ((__normal_iterator<BitState_const*,std::vector<BitState,std::allocator<BitState>>> *)
             &local_c8,&local_d0);
  local_d8._M_current =
       (BitState *)std::vector<BitState,_std::allocator<BitState>_>::begin(&this->mFakeAckField);
  local_e0 = (BitState *)std::vector<BitState,_std::allocator<BitState>_>::end(&this->mFakeAckField)
  ;
  local_e8 = (BitState *)
             std::vector<BitState,std::allocator<BitState>>::
             insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>,void>
                       ((vector<BitState,std::allocator<BitState>> *)&this->mFakeFixedFormBits,
                        local_c8,local_d8,
                        (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>
                         )local_e0);
  local_f8._M_current =
       (BitState *)std::vector<BitState,_std::allocator<BitState>_>::end(&this->mFakeFixedFormBits);
  __gnu_cxx::__normal_iterator<BitState_const*,std::vector<BitState,std::allocator<BitState>>>::
  __normal_iterator<BitState*>
            ((__normal_iterator<BitState_const*,std::vector<BitState,std::allocator<BitState>>> *)
             &local_f0,&local_f8);
  __first = std::vector<BitState,_std::allocator<BitState>_>::begin(&this->mFakeEndOfFrame);
  __last = std::vector<BitState,_std::allocator<BitState>_>::end(&this->mFakeEndOfFrame);
  std::vector<BitState,std::allocator<BitState>>::
  insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>,void>
            ((vector<BitState,std::allocator<BitState>> *)&this->mFakeFixedFormBits,local_f0,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             __first._M_current,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             __last._M_current);
  return;
}

Assistant:

void CanSimulationDataGenerator::CreateDataOrRemoteFrame( U32 identifier, bool use_extended_frame_format, bool remote_frame,
                                                          std::vector<U8>& data, bool get_ack_in_response )
{
    // A DATA FRAME is composed of seven different bit fields:
    // START OF FRAME, ARBITRATION FIELD, CONTROL FIELD, DATA FIELD, CRC
    // FIELD, ACK FIELD, END OF FRAME. The DATA FIELD can be of length zero.

    mFakeStuffedBits.clear();
    mFakeFixedFormBits.clear();
    mFakeStartOfFrameField.clear();
    mFakeArbitrationField.clear();
    mFakeControlField.clear();
    mFakeDataField.clear();
    mFakeCrcFieldWithoutDelimiter.clear();
    mFakeAckField.clear();
    mFakeEndOfFrame.clear();

    // START OF FRAME (Standard Format as well as Extended Format)
    // The START OF FRAME (SOF) marks the beginning of DATA FRAMES and REMOTE
    // FRAMEs. It consists of a single dominant bit.
    // A station is only allowed to start transmission when the bus is idle (see INTERFRAME
    // Spacing). All stations have to synchronize to the leading edge caused by START OF
    // FRAME (see HARD SYNCHRONIZATION) of the station starting transmission first.

    mFakeStartOfFrameField.push_back( mSettings->Dominant() );

    // ARBITRATION FIELD
    // The format of the ARBITRATION FIELD is different for Standard Format and
    // Extended Format Frames.

    // In Standard Format the ARBITRATION FIELD consists of the 11 bit IDENTIFIER
    // and the RTR-BIT. The IDENTIFIER bits are denoted ID-28 ... ID-18.

    // In Extended Format the ARBITRATION FIELD consists of the 29 bit IDENTIFIER,
    // the SRR-Bit, the IDE-Bit, and the RTR-BIT. The IDENTIFIER bits are denoted ID-28
    //... ID-0.

    if( use_extended_frame_format == true )
    {
        U32 mask = 1 << 28; // 28 bits in exdended format's identifier.

        // IDENTIFIER - Extended Format
        // In contrast to the Standard Format the Extended Format consists of 29 bits. The
        // format comprises two sections:

        // Base ID
        // The Base ID consists of 11 bits. It is transmitted in the order from ID-28 to ID-18. It
        // is equivalent to format of the Standard Identifier. The Base ID defines the Extended
        // Frames base priority.

        // Extended ID
        // The Extended ID consists of 18 bits. It is transmitted in the order of ID-17 to ID-0.

        // 11 bits of identifier:
        for( U32 i = 0; i < 11; i++ )
        {
            if( ( mask & identifier ) == 0 )
                mFakeArbitrationField.push_back( mSettings->Dominant() );
            else
                mFakeArbitrationField.push_back( mSettings->Recessive() );

            mask >>= 1;
        }

        // the next bit is SRR
        // SRR BIT (Extended Format)
        // Substitute Remote Request BIT
        // The SRR is a recessive bit. It is transmitted in Extended Frames at the position of the
        // RTR bit in Standard Frames and so substitutes the RTR-Bit in the Standard Frame.
        // Therefore, collisions of a Standard Frame and an Extended Frame, the Base ID (see
        // Extended IDENTIFIER below) of which is the same as the Standard Frames Identifier,
        // are resolved in such a way that the Standard Frame prevails the Extended Frame.

        mFakeArbitrationField.push_back( mSettings->Recessive() ); // SSR bit

        // the next bit is IDE
        // IDE BIT (Extended Format)
        // Identifier Extension Bit
        // The IDE Bit belongs to
        //- the ARBITRATION FIELD for the Extended Format
        //- the Control Field for the Standard Format
        // The IDE bit in the Standard Format is transmitted dominant, whereas in the Extended
        // Format the IDE bit is recessive.

        mFakeArbitrationField.push_back( mSettings->Recessive() ); // IDE bit

        // 18 bits of identifier:
        for( U32 i = 0; i < 18; i++ )
        {
            if( ( mask & identifier ) == 0 )
                mFakeArbitrationField.push_back( mSettings->Dominant() );
            else
                mFakeArbitrationField.push_back( mSettings->Recessive() );

            mask >>= 1;
        }

        // the next bit is RTR
        // RTR BIT (Standard Format as well as Extended Format)
        // Remote Transmission Request BIT
        // In DATA FRAMEs the RTR BIT has to be dominant. Within a REMOTE FRAME the
        // RTR BIT has to be recessive.

        if( remote_frame == true )
            mFakeArbitrationField.push_back( mSettings->Recessive() ); // RTR bit
        else
            mFakeArbitrationField.push_back( mSettings->Dominant() ); // RTR bit


        // next is the control field.  r1, r0, DLC3, DLC2, DLC1, DLC0

        // CONTROL FIELD (Standard Format as well as Extended Format)
        // The CONTROL FIELD consists of six bits. The format of the CONTROL FIELD is
        // different for Standard Format and Extended Format. Frames in Standard Format
        // include the DATA LENGTH CODE, the IDE bit, which is transmitted dominant (see
        // above), and the reserved bit r0. Frames in the Extended Format include the DATA
        // LENGTH CODE and two reserved bits r1 and r0. The reserved bits have to be sent
        // dominant, but receivers accept dominant and recessive bits in all combinations.

        mFakeControlField.push_back( mSettings->Recessive() ); // r1 bit
        mFakeControlField.push_back( mSettings->Recessive() ); // r0 bit
    }
    else
    {
        // IDENTIFIER
        // IDENTIFIER - Standard Format
        // The IDENTIFIERs length is 11 bits and corresponds to the Base ID in Extended
        // Format. These bits are transmitted in the order from ID-28 to ID-18. The least
        // significant bit is ID-18. The 7 most significant bits (ID-28 - ID-22) must not be all
        // recessive.

        // In a Standard Frame the IDENTIFIER is followed by the RTR bit.
        // RTR BIT (Standard Format as well as Extended Format)
        // Remote Transmission Request BIT
        // In DATA FRAMEs the RTR BIT has to be dominant. Within a REMOTE FRAME the
        // RTR BIT has to be recessive.


        U32 mask = 1 << 10;
        for( U32 i = 0; i < 11; i++ )
        {
            if( ( mask & identifier ) == 0 )
                mFakeArbitrationField.push_back( mSettings->Dominant() );
            else
                mFakeArbitrationField.push_back( mSettings->Recessive() );

            mask >>= 1;
        }

        // the next bit is RTR
        // RTR BIT (Standard Format as well as Extended Format)
        // Remote Transmission Request BIT
        // In DATA FRAMEs the RTR BIT has to be dominant. Within a REMOTE FRAME the
        // RTR BIT has to be recessive.

        if( remote_frame == true )
            mFakeArbitrationField.push_back( mSettings->Recessive() ); // RTR bit
        else
            mFakeArbitrationField.push_back( mSettings->Dominant() ); // RTR bit

        // next is the control field.  r1, r0, DLC3, DLC2, DLC1, DLC0

        // CONTROL FIELD (Standard Format as well as Extended Format)
        // The CONTROL FIELD consists of six bits. The format of the CONTROL FIELD is
        // different for Standard Format and Extended Format. Frames in Standard Format
        // include the DATA LENGTH CODE, the IDE bit, which is transmitted dominant (see
        // above), and the reserved bit r0. Frames in the Extended Format include the DATA
        // LENGTH CODE and two reserved bits r1 and r0. The reserved bits have to be sent
        // dominant, but receivers accept dominant and recessive bits in all combinations.

        mFakeControlField.push_back( mSettings->Dominant() ); // IDE bit
        mFakeControlField.push_back( mSettings->Dominant() ); // r0 bit
    }


    // send 4 bits for the length of the attached data.
    U32 data_size = data.size();
    if( data_size > 9 )
        AnalyzerHelpers::Assert( "can't sent more than 8 bytes" );

    if( remote_frame == true )
        if( data_size != 0 )
            AnalyzerHelpers::Assert( "remote frames can't send data" );

    U32 mask = 1 << 3;
    for( U32 i = 0; i < 4; i++ )
    {
        if( ( mask & data_size ) == 0 )
            mFakeControlField.push_back( mSettings->Dominant() );
        else
            mFakeControlField.push_back( mSettings->Recessive() );

        mask >>= 1;
    }

    // next is the DATA FIELD
    // DATA FIELD (Standard Format as well as Extended Format)
    // The DATA FIELD consists of the data to be transferred within a DATA FRAME. It can
    // contain from 0 to 8 bytes, which each contain 8 bits which are transferred MSB first.

    if( remote_frame == false )
    {
        for( U32 i = 0; i < data_size; i++ )
        {
            U32 dat = data[ i ];
            U32 mask = 0x80;

            for( U32 j = 0; j < 8; j++ )
            {
                if( ( mask & dat ) == 0 )
                    mFakeDataField.push_back( mSettings->Dominant() );
                else
                    mFakeDataField.push_back( mSettings->Recessive() );

                mask >>= 1;
            }
        }
    }

    // CRC FIELD (Standard Format as well as Extended Format)
    // contains the CRC SEQUENCE followed by a CRC DELIMITER.

    AddCrc();


    // ACK FIELD (Standard Format as well as Extended Format)
    // The ACK FIELD is two bits long and contains the ACK SLOT and the ACK DELIMITER.
    // In the ACK FIELD the transmitting station sends two recessive bits.
    // A RECEIVER which has received a valid message correctly, reports this to the
    // TRANSMITTER by sending a dominant bit during the ACK SLOT (it sends ACK).

    // ACK SLOT
    // All stations having received the matching CRC SEQUENCE report this within the ACK
    // SLOT by superscribing the recessive bit of the TRANSMITTER by a dominant bit.

    if( get_ack_in_response == true )
        mFakeAckField.push_back( mSettings->Dominant() );
    else
        mFakeAckField.push_back( mSettings->Recessive() );

    // ACK DELIMITER
    // The ACK DELIMITER is the second bit of the ACK FIELD and has to be a recessive
    // bit. As a consequence, the ACK SLOT is surrounded by two recessive bits (CRC
    // DELIMITER, ACK DELIMITER).

    mFakeAckField.push_back( mSettings->Recessive() );

    // END OF FRAME (Standard Format as well as Extended Format)
    // Each DATA FRAME and REMOTE FRAME is delimited by a flag sequence consisting
    // of seven recessive bits.

    for( U32 i = 0; i < 7; i++ )
        mFakeEndOfFrame.push_back( mSettings->Recessive() );


    mFakeFixedFormBits.insert( mFakeFixedFormBits.end(), mFakeAckField.begin(), mFakeAckField.end() );
    mFakeFixedFormBits.insert( mFakeFixedFormBits.end(), mFakeEndOfFrame.begin(), mFakeEndOfFrame.end() );
}